

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_compose.cxx
# Opt level: O0

int Fl::compose(int *del)

{
  byte bVar1;
  uchar ascii;
  int condition;
  int *del_local;
  
  bVar1 = *e_text;
  if ((e_state & 0x4c0000U) == 0 || (bVar1 & 0x80) != 0) {
    *del = compose_state;
    compose_state = 0;
    if (((bVar1 & 0xe0) == 0) || (bVar1 == 0x7f)) {
      del_local._4_4_ = 0;
    }
    else {
      del_local._4_4_ = 1;
    }
  }
  else {
    *del = 0;
    del_local._4_4_ = 0;
  }
  return del_local._4_4_;
}

Assistant:

int Fl::compose(int& del) {
  int condition;
#if defined(__APPLE__)
  int has_text_key = Fl::compose_state || Fl::e_keysym <= '~' || Fl::e_keysym == FL_Iso_Key ||
  (Fl::e_keysym >= FL_KP && Fl::e_keysym <= FL_KP_Last && Fl::e_keysym != FL_KP_Enter);
  condition = Fl::e_state&(FL_META | FL_CTRL) || 
      (Fl::e_keysym >= FL_Shift_L && Fl::e_keysym <= FL_Alt_R) || // called from flagsChanged
      !has_text_key ;
#else
unsigned char ascii = (unsigned char)e_text[0];
#if defined(WIN32)
  condition = (e_state & (FL_ALT | FL_META)) && !(ascii & 128) ;
#else
  condition = (e_state & (FL_ALT | FL_META | FL_CTRL)) && !(ascii & 128) ;
#endif // WIN32
#endif // __APPLE__
  if (condition) { del = 0; return 0;} // this stuff is to be treated as a function key
  del = Fl::compose_state;
#ifdef __APPLE__
  Fl::compose_state = Fl_X::next_marked_length;
#else
  Fl::compose_state = 0;
// Only insert non-control characters:
  if ( (!Fl::compose_state) && ! (ascii & ~31 && ascii!=127)) { return 0; }
#endif
  return 1;
}